

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

void prf_state_matrix_mult_right(prf_state_t *state,matrix4x4_f32_t *m)

{
  void *__src;
  long in_RSI;
  long in_RDI;
  int n;
  int j;
  int i;
  matrix4x4_f32_t *matrix;
  matrix4x4_f32_t copy;
  int local_6c;
  int local_68;
  int local_64;
  float local_58 [18];
  long local_10;
  long local_8;
  
  __src = *(void **)(*(long *)(in_RDI + 0x48) + (ulong)*(ushort *)(in_RDI + 0x7e) * 8);
  local_10 = in_RSI;
  local_8 = in_RDI;
  memcpy(local_58,__src,0x40);
  for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
    for (local_68 = 0; local_68 < 4; local_68 = local_68 + 1) {
      *(undefined4 *)((long)__src + (long)local_68 * 4 + (long)local_64 * 0x10) = 0;
      for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
        *(float *)((long)__src + (long)local_68 * 4 + (long)local_64 * 0x10) =
             local_58[(long)local_64 * 4 + (long)local_6c] *
             *(float *)(local_10 + (long)local_6c * 0x10 + (long)local_68 * 4) +
             *(float *)((long)__src + (long)local_68 * 4 + (long)local_64 * 0x10);
      }
    }
  }
  *(undefined4 *)(local_8 + 0x58) = 1;
  return;
}

Assistant:

void
prf_state_matrix_mult_right(
    prf_state_t * state,
    matrix4x4_f32_t * m )
{
    matrix4x4_f32_t copy;
    matrix4x4_f32_t * matrix;
    int i, j, n;

    assert( state != NULL && m != NULL );

    matrix = state->matrix[ state->state_push_level ];
    memcpy( &copy, matrix, sizeof( matrix4x4_f32_t ) );

    /* right-multiplication of matrix */
    for ( i = 0; i < 4; i++ ) {
        for ( j = 0; j < 4; j++ ) {
            (*matrix)[i][j] = 0.0f;
            for ( n = 0; n < 4; n++ )
                (*matrix)[i][j] += copy[i][n] * (*m)[n][j];
        }
    }
    state->inv_dirty = TRUE;

}